

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.H
# Opt level: O2

void amrex::average_down_nodal<amrex::FArrayBox>
               (FabArray<amrex::FArrayBox> *fine,FabArray<amrex::FArrayBox> *crse,IntVect *ratio,
               int ngcrse,bool mfiter_is_definitely_safe)

{
  uint nvar;
  int iVar1;
  int iVar2;
  IntVect *pIVar3;
  FabArray<amrex::FArrayBox> *this;
  ulong uVar4;
  bool bVar5;
  Periodicity *period;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined7 in_register_00000081;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long lVar12;
  long lVar13;
  long local_2d8;
  undefined8 local_2d0;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  FabArray<amrex::FArrayBox> *local_2b0;
  IntVect *local_2a8;
  FabArray<amrex::FArrayBox> *local_2a0;
  long local_298;
  ulong local_290;
  ulong local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  undefined1 local_258 [24];
  pointer local_240;
  undefined8 uStack_238;
  int local_230;
  BoxArray local_218;
  MFIter mfi;
  
  nvar = (crse->super_FabArrayBase).n_comp;
  if (((int)CONCAT71(in_register_00000081,mfiter_is_definitely_safe) != 0) ||
     (bVar5 = isMFIterSafe(&fine->super_FabArrayBase,&crse->super_FabArrayBase), bVar5)) {
    local_2b0 = fine;
    MFIter::MFIter(&mfi,&crse->super_FabArrayBase,true);
    if ((int)nvar < 1) {
      nvar = 0;
    }
    local_290 = (ulong)nvar;
    local_2a8 = ratio;
    local_2a0 = crse;
    while (this = local_2a0, pIVar3 = local_2a8, mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox((Box *)&local_2d0,&mfi,ngcrse);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>((Array4<double> *)&local_218,this,&mfi)
      ;
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_258,local_2b0,&mfi);
      local_260 = (long)local_2d0._4_4_;
      local_298 = (long)local_2c8;
      iVar1 = pIVar3->vect[0];
      iVar2 = pIVar3->vect[2];
      local_270 = (long)(int)local_2d0 * 8;
      local_278 = local_270 * iVar1;
      local_280 = local_260 * pIVar3->vect[1];
      local_268 = (long)pIVar3->vect[1] * 8;
      local_2d8 = 0;
      uVar4 = 0;
      while (uVar7 = uVar4, lVar9 = local_298, iVar6 = local_2c8 * iVar2, uVar7 != local_290) {
        for (; (int)lVar9 <= local_2bc; lVar9 = lVar9 + 1) {
          puVar11 = (undefined8 *)
                    (local_258._0_8_ +
                    (long)local_240 * local_2d8 +
                    ((long)iVar6 - (long)local_230) * local_258._16_8_ * 8 +
                    (local_280 - uStack_238._4_4_) * local_258._8_8_ * 8 +
                    (long)(int)uStack_238 * -8 + local_278);
          lVar13 = local_218.m_bat._0_8_ +
                   local_218.m_bat.m_op._20_8_ * local_2d8 +
                   (local_260 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                   local_218.m_bat.m_op._4_8_ * 8 +
                   (lVar9 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                   local_218.m_bat.m_op._12_8_ * 8 +
                   (long)local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * -8 + local_270;
          for (lVar12 = local_260; lVar12 <= local_2c0; lVar12 = lVar12 + 1) {
            if ((int)local_2d0 <= local_2c4) {
              lVar8 = 0;
              puVar10 = puVar11;
              do {
                *(undefined8 *)(lVar13 + lVar8 * 8) = *puVar10;
                puVar10 = puVar10 + iVar1;
                lVar8 = lVar8 + 1;
              } while ((local_2c4 - (int)local_2d0) + 1 != (int)lVar8);
            }
            puVar11 = (undefined8 *)((long)puVar11 + local_258._8_8_ * local_268);
            lVar13 = lVar13 + local_218.m_bat.m_op._4_8_ * 8;
          }
          iVar6 = iVar6 + iVar2;
        }
        local_2d8 = local_2d8 + 8;
        local_288 = uVar7;
        uVar4 = uVar7 + 1;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,&(fine->super_FabArrayBase).boxarray,ratio);
    local_258._0_8_ = (double *)0x1;
    local_258._8_8_ = (Arena *)0x0;
    local_258._16_8_ = (pointer)0x0;
    local_240 = (pointer)0x0;
    uStack_238 = (pointer)0x0;
    local_2d0 = &PTR__FabFactory_007d2928;
    FabArray<amrex::FArrayBox>::FabArray
              ((FabArray<amrex::FArrayBox> *)&mfi,&local_218,
               &(fine->super_FabArrayBase).distributionMap,nvar,ngcrse,(MFInfo *)local_258,
               (FabFactory<amrex::FArrayBox> *)&local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_258 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_nodal<amrex::FArrayBox>(fine,(FabArray<amrex::FArrayBox> *)&mfi,ratio,ngcrse,false)
    ;
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (crse,(FabArray<amrex::FArrayBox> *)&mfi,0,0,nvar,ngcrse,ngcrse,period,COPY);
    FabArray<amrex::FArrayBox>::~FabArray((FabArray<amrex::FArrayBox> *)&mfi);
  }
  return;
}

Assistant:

void average_down_nodal (const FabArray<FAB>& fine, FabArray<FAB>& crse,
                         const IntVect& ratio, int ngcrse, bool mfiter_is_definitely_safe)
{
    AMREX_ASSERT(fine.is_nodal());
    AMREX_ASSERT(crse.is_nodal());
    AMREX_ASSERT(crse.nComp() == fine.nComp());

    int ncomp = crse.nComp();
    using value_type = typename FAB::value_type;

    if (mfiter_is_definitely_safe || isMFIterSafe(fine, crse))
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.growntilebox(ngcrse);
            Array4<value_type> const& crsearr = crse.array(mfi);
            Array4<value_type const> const& finearr = fine.const_array(mfi);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                amrex_avgdown_nodes(tbx,crsearr,finearr,0,0,ncomp,ratio);
            });
        }
    }
    else
    {
        FabArray<FAB> ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                           ncomp, ngcrse);
        average_down_nodal(fine, ctmp, ratio, ngcrse);
        crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
    }
}